

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetSchnorrPubkeyFromPrivkey(void *handle,char *privkey,char **pubkey,bool *parity)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Privkey privkey_obj;
  string local_60;
  SchnorrPubkey schnorr_pubkey;
  
  cfd::Initialize();
  if (pubkey == (char **)0x0) {
    privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x1a0;
    privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdGetSchnorrPubkeyFromPrivkey";
    cfd::core::logger::warn<>((CfdSourceLocation *)&privkey_obj,"pubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&privkey_obj,"Failed to parameter. pubkey is null.",(allocator *)&local_60)
    ;
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&privkey_obj);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_60,privkey,(allocator *)&schnorr_pubkey);
    cfd::core::Privkey::Privkey(&privkey_obj,&local_60,kMainnet,true);
    std::__cxx11::string::~string((string *)&local_60);
    cfd::core::SchnorrPubkey::FromPrivkey(&schnorr_pubkey,&privkey_obj,parity);
    cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_60,&schnorr_pubkey);
    pcVar2 = cfd::capi::CreateString(&local_60);
    *pubkey = pcVar2;
    std::__cxx11::string::~string((string *)&local_60);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&schnorr_pubkey);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey_obj);
    return 0;
  }
  privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x1a6;
  privkey_obj.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetSchnorrPubkeyFromPrivkey";
  cfd::core::logger::warn<>((CfdSourceLocation *)&privkey_obj,"privkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&privkey_obj,"Failed to parameter. privkey is null or empty.",
             (allocator *)&local_60);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&privkey_obj);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSchnorrPubkeyFromPrivkey(
    void* handle, const char* privkey, char** pubkey, bool* parity) {
  try {
    cfd::Initialize();
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    Privkey privkey_obj = Privkey(std::string(privkey));
    SchnorrPubkey schnorr_pubkey =
        SchnorrPubkey::FromPrivkey(privkey_obj, parity);
    *pubkey = CreateString(schnorr_pubkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}